

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_writer.cpp
# Opt level: O2

void __thiscall
charls::jpeg_stream_writer::write_spiff_header_segment
          (jpeg_stream_writer *this,spiff_header *header)

{
  uint __line;
  char *__assertion;
  
  if (header->height == 0) {
    __assertion = "header.height > 0";
    __line = 0x2b;
  }
  else {
    if (header->width != 0) {
      write_segment_header(this,application_data8,0x1e);
      write_bytes(this,&write_spiff_header_segment::spiff_magic_id,6);
      write_uint8(this,'\x02');
      write_uint8(this,'\0');
      write_uint8(this,header->profile_id);
      write_uint8(this,header->component_count);
      write_uint<unsigned_int>(this,header->height);
      write_uint<unsigned_int>(this,header->width);
      write_uint8(this,header->color_space);
      write_uint8(this,header->bits_per_sample);
      write_uint8(this,header->compression_type);
      write_uint8(this,header->resolution_units);
      write_uint<unsigned_int>(this,header->vertical_resolution);
      write_uint<unsigned_int>(this,header->horizontal_resolution);
      return;
    }
    __assertion = "header.width > 0";
    __line = 0x2c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_writer.cpp"
                ,__line,
                "void charls::jpeg_stream_writer::write_spiff_header_segment(const spiff_header &)")
  ;
}

Assistant:

void jpeg_stream_writer::write_spiff_header_segment(const spiff_header& header)
{
    ASSERT(header.height > 0);
    ASSERT(header.width > 0);

    static constexpr array<uint8_t, 6> spiff_magic_id{{'S', 'P', 'I', 'F', 'F', '\0'}};

    // Create a JPEG APP8 segment in Still Picture Interchange File Format (SPIFF), v2.0
    write_segment_header(jpeg_marker_code::application_data8, 30);
    write_bytes(spiff_magic_id.data(), spiff_magic_id.size());
    write_uint8(spiff_major_revision_number);
    write_uint8(spiff_minor_revision_number);
    write_uint8(to_underlying_type(header.profile_id));
    write_uint8(header.component_count);
    write_uint32(header.height);
    write_uint32(header.width);
    write_uint8(to_underlying_type(header.color_space));
    write_uint8(header.bits_per_sample);
    write_uint8(to_underlying_type(header.compression_type));
    write_uint8(to_underlying_type(header.resolution_units));
    write_uint32(header.vertical_resolution);
    write_uint32(header.horizontal_resolution);
}